

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O3

void __thiscall Pl_RunLength::flush_encode(Pl_RunLength *this)

{
  state_e sVar1;
  uint uVar2;
  Members *pMVar3;
  _func_int **pp_Var4;
  logic_error *this_00;
  ulong uVar5;
  Pipeline *pPVar6;
  uchar ch_1;
  uchar ch;
  undefined1 local_12;
  undefined1 local_11;
  
  pMVar3 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
           ._M_t.
           super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
           .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
  sVar1 = pMVar3->state;
  uVar2 = pMVar3->length;
  if (uVar2 == 0x80) {
    if (sVar1 == st_run) goto LAB_001382fc;
LAB_00138330:
    pPVar6 = (this->super_Pipeline).next_;
    (*pPVar6->_vptr_Pipeline[2])(pPVar6,&local_12,1);
    pPVar6 = (this->super_Pipeline).next_;
    pMVar3 = (this->m)._M_t.
             super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
             ._M_t.
             super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
             .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
    uVar5 = (ulong)pMVar3->length;
    pp_Var4 = pPVar6->_vptr_Pipeline;
  }
  else {
    if (sVar1 != st_run) {
      if (uVar2 == 0) goto LAB_00138360;
      goto LAB_00138330;
    }
    if (uVar2 - 0x81 < 0xffffff81) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Pl_RunLength: invalid length in flush_encode for run");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
LAB_001382fc:
    pPVar6 = (this->super_Pipeline).next_;
    (*pPVar6->_vptr_Pipeline[2])(pPVar6,&local_11,1);
    pPVar6 = (this->super_Pipeline).next_;
    pMVar3 = (this->m)._M_t.
             super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
             ._M_t.
             super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
             .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
    pp_Var4 = pPVar6->_vptr_Pipeline;
    uVar5 = 1;
  }
  (*pp_Var4[2])(pPVar6,pMVar3->buf,uVar5);
LAB_00138360:
  pMVar3 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
           ._M_t.
           super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
           .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
  pMVar3->state = st_top;
  pMVar3->length = 0;
  return;
}

Assistant:

void
Pl_RunLength::flush_encode()
{
    if (m->length == 128) {
        QTC::TC(
            "libtests",
            "Pl_RunLength flush full buffer",
            (m->state == st_copying   ? 0
                 : m->state == st_run ? 1
                                      : -1));
    }
    if (m->length == 0) {
        QTC::TC("libtests", "Pl_RunLength flush empty buffer");
    }
    if (m->state == st_run) {
        if ((m->length < 2) || (m->length > 128)) {
            throw std::logic_error("Pl_RunLength: invalid length in flush_encode for run");
        }
        auto ch = static_cast<unsigned char>(257 - m->length);
        next()->write(&ch, 1);
        next()->write(&m->buf[0], 1);
    } else if (m->length > 0) {
        auto ch = static_cast<unsigned char>(m->length - 1);
        next()->write(&ch, 1);
        next()->write(m->buf, m->length);
    }
    m->state = st_top;
    m->length = 0;
}